

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateBreak(ExpressionTranslateContext *ctx,ExprBreak *expression)

{
  bool bVar1;
  uint uVar2;
  ExprSequence *pEVar3;
  uint *puVar4;
  ExprSequence *closures;
  ExprBreak *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  pEVar3 = getType<ExprSequence>(expression->closures);
  if ((pEVar3 != (ExprSequence *)0x0) &&
     (bVar1 = SmallArray<ExprBase_*,_4U>::empty(&pEVar3->expressions), !bVar1)) {
    Translate(ctx,expression->closures);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
  }
  uVar2 = SmallArray<unsigned_int,_32U>::size(&ctx->loopBreakIdStack);
  puVar4 = SmallArray<unsigned_int,_32U>::operator[]
                     (&ctx->loopBreakIdStack,
                      uVar2 - *(int *)&(expression->super_ExprBase).field_0x2c);
  Print(ctx,"goto break_%d;",(ulong)*puVar4);
  return;
}

Assistant:

void TranslateBreak(ExpressionTranslateContext &ctx, ExprBreak *expression)
{
	if(ExprSequence *closures = getType<ExprSequence>(expression->closures))
	{
		if(!closures->expressions.empty())
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}
	}

	Print(ctx, "goto break_%d;", ctx.loopBreakIdStack[ctx.loopBreakIdStack.size() - expression->depth]);
}